

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

int replace_escaped(char *in,size_t index,size_t *max)

{
  int iVar1;
  ushort **ppuVar2;
  ulong uVar3;
  int iVar4;
  int tempInt;
  undefined4 local_2c;
  
  local_2c = 0;
  iVar4 = 0;
  if (in[index] == '%') {
    ppuVar2 = __ctype_b_loc();
    iVar4 = 0;
    if (((*(byte *)((long)*ppuVar2 + (long)in[index + 1] * 2 + 1) & 0x10) != 0) &&
       ((*(byte *)((long)*ppuVar2 + (long)in[index + 2] * 2 + 1) & 0x10) != 0)) {
      iVar4 = 0;
      iVar1 = __isoc99_sscanf(in + index + 1,"%2x",&local_2c);
      if (iVar1 == 1) {
        uVar3 = *max;
        if (index < uVar3) {
          do {
            in[index] = (char)local_2c;
            if (index + 3 < *max) {
              local_2c._0_1_ = in[index + 3];
            }
            else {
              local_2c._0_1_ = '\0';
            }
            index = index + 1;
            uVar3 = *max;
          } while (index < uVar3);
        }
        *max = uVar3 - 2;
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

int replace_escaped(char *in, size_t index, size_t *max)
{
	int tempInt = 0;
	char tempChar = 0;
	size_t i = (size_t)0;
	size_t j = (size_t)0;

	if (in[index] == '%' && isxdigit(in[index + (size_t)1]) &&
		isxdigit(in[index + (size_t)2])) {
		/* Note the "%2x", makes sure that we convert a maximum of two
		 * characters. */
#ifdef _WIN32
		if (sscanf_s(&in[index + (size_t)1],
#else
		if (sscanf(&in[index + (size_t)1],
#endif
			    "%2x",
			    (unsigned int *)&tempInt) != 1) {
			return 0;
		}
		tempChar = (char)tempInt;
		for (i = index + (size_t)3, j = index; j < *max; i++, j++) {
			in[j] = tempChar;
			if (i < *max) {
				tempChar = in[i];
			} else {
				tempChar = 0;
			}
		}
		*max -= (size_t)2;
		return 1;
	} else {
		return 0;
	}
}